

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

int __thiscall
CVmObjFrameDesc::getp_get_vars(CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  uint *puVar1;
  CVmObjPageEntry *pCVar2;
  CVmObjPageEntry *pCVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  undefined4 in_register_00000034;
  long lVar14;
  bool bVar15;
  CVmDbgFrameSymPtr sym;
  vm_val_t key;
  vm_val_t val;
  
  if (getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar7 = __cxa_guard_acquire(&getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar7 != 0) {
      getp_get_vars::desc.min_argc_ = 0;
      getp_get_vars::desc.opt_argc_ = 0;
      getp_get_vars::desc.varargs_ = 0;
      __cxa_guard_release(&getp_get_vars(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_vars::desc);
  if (iVar7 == 0) {
    vVar8 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar6 = sp_;
    puVar1 = (uint *)(this->super_CVmObject).ext_;
    uVar13 = *puVar1;
    pCVar2 = G_obj_table_X.pages_[uVar13 >> 0xc];
    uVar13 = uVar13 & 0xfff;
    lVar14 = *(long *)(*(long *)((long)&pCVar2[uVar13].ptr_ + 8) + 0x18);
    if ((lVar14 != 0) && ((ulong)*(ushort *)(lVar14 + 8) != 0)) {
      pCVar3 = G_obj_table_X.pages_[vVar8 >> 0xc];
      lVar14 = lVar14 + (ulong)*(ushort *)(lVar14 + 8);
      lVar9 = (long)(int)puVar1[1];
      lVar11 = *(ushort *)(G_dbg_hdr_size_X + lVar14) * G_line_entry_size_X +
               lVar14 + G_dbg_hdr_size_X;
      lVar9 = lVar11 + lVar9 * 2 + (ulong)*(ushort *)(lVar11 + 4 + lVar9 * 2);
      uVar5 = *(undefined4 *)&retval->field_0x4;
      aVar4 = retval->val;
      sp_ = sp_ + 1;
      pvVar6->typ = retval->typ;
      *(undefined4 *)&pvVar6->field_0x4 = uVar5;
      pvVar6->val = aVar4;
      while( true ) {
        sym.p_ = (uchar *)((long)G_dbg_frame_size_X + lVar9 + 4);
        uVar12 = (uint)*(ushort *)(lVar9 + 6);
        while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
          CVmDbgFrameSymPtr::get_str_val(&sym,&key);
          pvVar6 = sp_;
          sp_ = sp_ + 1;
          pvVar6->typ = key.typ;
          *(undefined4 *)&pvVar6->field_0x4 = key._4_4_;
          pvVar6->val = key.val;
          iVar7 = CVmObjLookupTable::index_check
                            ((CVmObjLookupTable *)(pCVar3 + (vVar8 & 0xfff)),&val,&key);
          if (iVar7 == 0) {
            CVmObjFrameRef::get_local_val((CVmObjFrameRef *)(pCVar2 + uVar13),&val,&sym);
            CVmObjLookupTable::add_entry((CVmObjLookupTable *)(pCVar3 + (vVar8 & 0xfff)),&key,&val);
          }
          sp_ = sp_ + -1;
          CVmDbgFrameSymPtr::inc(&sym);
        }
        uVar10 = (ulong)*(ushort *)(lVar9 + 4);
        if (uVar10 == 0) break;
        lVar9 = *(ushort *)(lVar14 + G_dbg_hdr_size_X) * G_line_entry_size_X +
                lVar14 + G_dbg_hdr_size_X;
        lVar9 = lVar9 + uVar10 * 2 + (ulong)*(ushort *)(lVar9 + 4 + uVar10 * 2);
      }
      sp_ = sp_ + -1;
    }
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_vars(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* create our lookup table object */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    CVmObjLookupTable *tab = (CVmObjLookupTable *)
                             vm_objp(vmg_ retval->val.obj);

    /* get our extension */
    vm_framedesc_ext *ext = get_ext();

    /* get our underlying frame ref and its extension */
    CVmObjFrameRef *fr = get_frame_ref(vmg0_);
    vm_frameref_ext *fext = fr->get_ext();

    /* set up pointer to this method's debug records */
    CVmDbgTablePtr dp;
    if (!dp.set(fext->entryp))
        return TRUE;

    /* set up a pointer to our frame */
    CVmDbgFramePtr dfp;
    dp.set_frame_ptr(vmg_ &dfp, ext->frame_idx);

    /* push the table for gc protection */
    G_stk->push(retval);

    /* walk up the list of frames from innermost to outermost */
    for (;;)
    {
        /* set up a pointer to the first symbol */
        CVmDbgFrameSymPtr sym;
        dfp.set_first_sym_ptr(vmg_ &sym);

        /* scan this frame's local symbol list */
        int sym_cnt = dfp.get_sym_count();
        for (int i = 0 ; i < sym_cnt ; ++i, sym.inc(vmg0_))
        {
            /* set up a string value for the key */
            vm_val_t key;
            sym.get_str_val(vmg_ &key);
            G_stk->push(&key);

            /* 
             *   If this entry isn't already in the table, add it.  Don't
             *   bother if it already exists: we work from inner to outer
             *   scopes, and inner scopes hide things in outer scopes, so if
             *   we find an entry in the table already it means that it was
             *   an inner-scope entry that hides the one we're processing
             *   now.  
             */
            vm_val_t val;
            if (!tab->index_check(vmg_ &val, &key))
            {
                /* get the value */
                fr->get_local_val(vmg_ &val, &sym);
                
                /* add the entry to the table */
                tab->add_entry(vmg_ &key, &val);
            }

            /* done with the key for gc protection */
            G_stk->discard();
        }

        /* move up to the enclosing frame */
        int parent = dfp.get_enclosing_frame();
        if (parent == 0)
            break;

        /* set up dfp to point to the parent fraem */
        dp.set_frame_ptr(vmg_ &dfp, parent);
    }

    /* discard the table ref we pushed for gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}